

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O1

bool __thiscall
bssl::NameConstraints::Parse
          (NameConstraints *this,Input extension_value,bool is_critical,CertErrors *errors)

{
  bool bVar1;
  uint uVar2;
  optional<bssl::der::Input> excluded_subtrees_value;
  optional<bssl::der::Input> permitted_subtrees_value;
  Parser sequence_parser;
  Parser extension_parser;
  _Storage<bssl::der::Input,_true> local_88;
  char local_78;
  _Storage<bssl::der::Input,_true> local_70;
  char local_60;
  Parser local_58;
  Parser local_40;
  
  if (errors == (CertErrors *)0x0) {
    abort();
  }
  bssl::der::Parser::Parser(&local_40,extension_value);
  bssl::der::Parser::Parser(&local_58);
  bVar1 = bssl::der::Parser::ReadSequence(&local_40,&local_58);
  if ((bVar1) && (bVar1 = bssl::der::Parser::HasMore(&local_40), !bVar1)) {
    local_60 = '\0';
    bVar1 = bssl::der::Parser::ReadOptionalTag
                      (&local_58,0xa0000000,(optional<bssl::der::Input> *)&local_70._M_value);
    if ((bVar1) &&
       ((local_60 != '\x01' ||
        (bVar1 = anon_unknown_0::ParseGeneralSubtrees
                           (local_70._M_value,&this->permitted_subtrees_,errors), bVar1)))) {
      uVar2 = 0x96;
      if (is_critical) {
        uVar2 = 0x1ff;
      }
      this->constrained_name_types_ =
           this->constrained_name_types_ | (this->permitted_subtrees_).present_name_types & uVar2;
      local_78 = '\0';
      bVar1 = bssl::der::Parser::ReadOptionalTag
                        (&local_58,0xa0000001,(optional<bssl::der::Input> *)&local_88._M_value);
      if (((bVar1) &&
          ((local_78 != '\x01' ||
           (bVar1 = anon_unknown_0::ParseGeneralSubtrees
                              (local_88._M_value,&this->excluded_subtrees_,errors), bVar1)))) &&
         ((this->constrained_name_types_ =
                this->constrained_name_types_ |
                uVar2 & (this->excluded_subtrees_).present_name_types, local_60 != '\0' ||
          (local_78 == '\x01')))) {
        bVar1 = bssl::der::Parser::HasMore(&local_58);
        return !bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool NameConstraints::Parse(der::Input extension_value, bool is_critical,
                            CertErrors *errors) {
  BSSL_CHECK(errors);

  der::Parser extension_parser(extension_value);
  der::Parser sequence_parser;

  // NameConstraints ::= SEQUENCE {
  //      permittedSubtrees       [0]     GeneralSubtrees OPTIONAL,
  //      excludedSubtrees        [1]     GeneralSubtrees OPTIONAL }
  if (!extension_parser.ReadSequence(&sequence_parser)) {
    return false;
  }
  if (extension_parser.HasMore()) {
    return false;
  }

  std::optional<der::Input> permitted_subtrees_value;
  if (!sequence_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0,
          &permitted_subtrees_value)) {
    return false;
  }
  if (permitted_subtrees_value &&
      !ParseGeneralSubtrees(permitted_subtrees_value.value(),
                            &permitted_subtrees_, errors)) {
    return false;
  }
  constrained_name_types_ |=
      permitted_subtrees_.present_name_types &
      (is_critical ? GENERAL_NAME_ALL_TYPES : kSupportedNameTypes);

  std::optional<der::Input> excluded_subtrees_value;
  if (!sequence_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 1,
          &excluded_subtrees_value)) {
    return false;
  }
  if (excluded_subtrees_value &&
      !ParseGeneralSubtrees(excluded_subtrees_value.value(),
                            &excluded_subtrees_, errors)) {
    return false;
  }
  constrained_name_types_ |=
      excluded_subtrees_.present_name_types &
      (is_critical ? GENERAL_NAME_ALL_TYPES : kSupportedNameTypes);

  // RFC 5280 section 4.2.1.10:
  // Conforming CAs MUST NOT issue certificates where name constraints is an
  // empty sequence. That is, either the permittedSubtrees field or the
  // excludedSubtrees MUST be present.
  if (!permitted_subtrees_value && !excluded_subtrees_value) {
    return false;
  }

  if (sequence_parser.HasMore()) {
    return false;
  }

  return true;
}